

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::geometry::anon_unknown_0::GeometryOutputCountTest::initPrograms
          (GeometryOutputCountTest *this,SourceCollections *sourceCollections)

{
  int *piVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  int iVar4;
  char *pcVar5;
  ostringstream src;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [40];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"#version 310 es\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 a_position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 1) in highp vec4 a_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 v_geom_FragColor;\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position = a_position;\n");
  poVar2 = std::operator<<(poVar2,"\tv_geom_FragColor = a_color;\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"vertex",&local_201);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  piVar1 = (this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)piVar1 == 8) {
    iVar4 = piVar1[1];
    if (piVar1[1] < *piVar1) {
      iVar4 = *piVar1;
    }
  }
  else {
    iVar4 = *piVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"#version 310 es\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_geometry_shader : require\n");
  poVar2 = std::operator<<(poVar2,
                           "#extension GL_OES_texture_storage_multisample_2d_array : require\n");
  poVar2 = std::operator<<(poVar2,"layout(points) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(triangle_strip, max_vertices = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  poVar2 = std::operator<<(poVar2,") out;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 v_geom_FragColor[];\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 v_frag_FragColor;\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tconst highp float rowHeight = 2.0 / float(");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,");\n");
  poVar2 = std::operator<<(poVar2,"\tconst highp float colWidth = 2.0 / float(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  pcVar5 = ");\n";
  std::operator<<(poVar2,");\n");
  if ((long)(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 8) {
    poVar2 = std::operator<<((ostream *)local_198,
                             "\thighp int emitCount = (gl_PrimitiveIDIn == 0) ? (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    poVar2 = std::operator<<(poVar2,") : (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[1]);
  }
  else {
    poVar2 = std::operator<<((ostream *)local_198,"\thighp int emitCount = ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    pcVar5 = ";\n";
  }
  std::operator<<(poVar2,pcVar5);
  poVar2 = std::operator<<((ostream *)local_198,
                           "\tfor (highp int ndx = 0; ndx < emitCount / 2; ndx++)\n");
  poVar2 = std::operator<<(poVar2,"\t{\n");
  poVar2 = std::operator<<(poVar2,
                           "\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, 0.0, 0.0, 0.0);\n"
                          );
  poVar2 = std::operator<<(poVar2,"\t\tv_frag_FragColor = v_geom_FragColor[0];\n");
  poVar2 = std::operator<<(poVar2,"\t\tEmitVertex();\n");
  poVar2 = std::operator<<(poVar2,
                           "\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, rowHeight, 0.0, 0.0);\n"
                          );
  poVar2 = std::operator<<(poVar2,"\t\tv_frag_FragColor = v_geom_FragColor[0];\n");
  poVar2 = std::operator<<(poVar2,"\t\tEmitVertex();\n");
  poVar2 = std::operator<<(poVar2,"\t}\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"geometry",&local_201);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"#version 310 es\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out mediump vec4 fragColor;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 v_frag_FragColor;\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tfragColor = v_frag_FragColor;\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"fragment",&local_201);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void GeometryOutputCountTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) in highp vec4 a_position;\n"
			<<"layout(location = 1) in highp vec4 a_color;\n"
			<<"layout(location = 0) out highp vec4 v_geom_FragColor;\n"
			<<"void main (void)\n"
			<<"{\n"
			<<"	gl_Position = a_position;\n"
			<<"	v_geom_FragColor = a_color;\n"
			<<"}\n";
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		const int max_vertices = m_pattern.size() == 2 ? std::max(m_pattern[0], m_pattern[1]) : m_pattern[0];

		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "#extension GL_OES_texture_storage_multisample_2d_array : require\n"
			<< "layout(points) in;\n"
			<< "layout(triangle_strip, max_vertices = " << max_vertices << ") out;\n"
			<< "layout(location = 0) in highp vec4 v_geom_FragColor[];\n"
			<< "layout(location = 0) out highp vec4 v_frag_FragColor;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	const highp float rowHeight = 2.0 / float(" << m_pattern.size() << ");\n"
			<< "	const highp float colWidth = 2.0 / float(" << max_vertices << ");\n";

		if (m_pattern.size() == 2)
			src	<< "	highp int emitCount = (gl_PrimitiveIDIn == 0) ? (" << m_pattern[0] << ") : (" << m_pattern[1] << ");\n";
		else
			src	<< "	highp int emitCount = " << m_pattern[0] << ";\n";
		src	<< "	for (highp int ndx = 0; ndx < emitCount / 2; ndx++)\n"
			<< "	{\n"
			<< "		gl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, 0.0, 0.0, 0.0);\n"
			<< "		v_frag_FragColor = v_geom_FragColor[0];\n"
			<< "		EmitVertex();\n"

			<< "		gl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, rowHeight, 0.0, 0.0);\n"
			<< "		v_frag_FragColor = v_geom_FragColor[0];\n"
			<< "		EmitVertex();\n"

			<< "	}\n"
			<< "}\n";
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) out mediump vec4 fragColor;\n"
			<<"layout(location = 0) in highp vec4 v_frag_FragColor;\n"
			<<"void main (void)\n"
			<<"{\n"
			<<"	fragColor = v_frag_FragColor;\n"
			<<"}\n";
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}